

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

ULONG __thiscall Diligent::anon_unknown_0::DxcBlobWrapper::Release(DxcBlobWrapper *this)

{
  atomic<long> *paVar1;
  long lVar2;
  IDataBlob *pIVar3;
  ULONG UVar4;
  string msg;
  string local_30;
  
  LOCK();
  paVar1 = &this->m_RefCount;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  UVar4 = lVar2 - 1;
  if (UVar4 == 0) {
    if ((this->m_RefCount).super___atomic_base<long>._M_i != 0) {
      FormatString<char[46]>
                (&local_30,(char (*) [46])"Destroying object with outstanding references");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"~DxcBlobWrapper",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                 ,0x10c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar3 = (this->m_pData).m_pObject;
    if (pIVar3 != (IDataBlob *)0x0) {
      (*(pIVar3->super_IObject)._vptr_IObject[2])();
      (this->m_pData).m_pObject = (IDataBlob *)0x0;
    }
    operator_delete(this,0x18);
  }
  return UVar4;
}

Assistant:

Release(void) override final
    {
        long RemainingRefs = m_RefCount.fetch_add(-1) - 1;
        if (RemainingRefs == 0)
            delete this;

        return RemainingRefs;
    }